

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pivotref.cpp
# Opt level: O1

PivotColumn * __thiscall
duckdb::PivotColumn::Copy(PivotColumn *__return_storage_ptr__,PivotColumn *this)

{
  pointer puVar1;
  pointer pPVar2;
  pointer pPVar3;
  pointer this_00;
  pointer this_01;
  PivotColumnEntry local_70;
  
  (__return_storage_ptr__->entries).
  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->unpivot_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->unpivot_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->pivot_expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->unpivot_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pivot_expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pivot_expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->pivot_enum)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pivot_enum).field_2;
  (__return_storage_ptr__->pivot_enum)._M_string_length = 0;
  (__return_storage_ptr__->pivot_enum).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->subquery).
  super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  this_00 = (this->pivot_expressions).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->pivot_expressions).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != puVar1) {
    do {
      pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_00);
      (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_70,pPVar3);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_70);
      if (local_70.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)&(local_70.values.
                                super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                _M_impl.super__Vector_impl_data._M_start)->type_ + 8))();
      }
      this_00 = this_00 + 1;
    } while (this_00 != puVar1);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__return_storage_ptr__->unpivot_names,
              &(this->unpivot_names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  this_01 = (this->entries).
            super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
            super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->entries).
           super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
           super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != pPVar2) {
    do {
      PivotColumnEntry::Copy(&local_70,this_01);
      ::std::vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>::
      emplace_back<duckdb::PivotColumnEntry>
                (&(__return_storage_ptr__->entries).
                  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>,
                 &local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.alias._M_dataplus._M_p != &local_70.alias.field_2) {
        operator_delete(local_70.alias._M_dataplus._M_p);
      }
      if (local_70.expr.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_70.expr.
                              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl
                    + 8))();
      }
      local_70.expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
            )0x0;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_70);
      this_01 = this_01 + 1;
    } while (this_01 != pPVar2);
  }
  ::std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->pivot_enum);
  return __return_storage_ptr__;
}

Assistant:

PivotColumn PivotColumn::Copy() const {
	PivotColumn result;
	for (auto &expr : pivot_expressions) {
		result.pivot_expressions.push_back(expr->Copy());
	}
	result.unpivot_names = unpivot_names;
	for (auto &entry : entries) {
		result.entries.push_back(entry.Copy());
	}
	result.pivot_enum = pivot_enum;
	return result;
}